

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timidity.cpp
# Opt level: O0

int Timidity::read_config_file(char *name,bool ismain)

{
  int iVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  ToneBank *pTVar5;
  char *__s1;
  int local_49c;
  int local_498;
  int instr;
  int bank_1;
  int drum;
  int order_1;
  int order;
  undefined1 local_478 [8];
  FCommandLine w;
  int lumpnum;
  int words;
  int line;
  int k;
  int j;
  int i;
  ToneBank *bank;
  char *cp;
  char tmp [1024];
  FileReader *fp;
  bool ismain_local;
  char *name_local;
  
  _j = (long *)0x0;
  lumpnum = 0;
  if (read_config_file::rcf_count < 0x33) {
    if (ismain) {
      pathExpander._16_4_ = 0;
    }
    tmp._1016_8_ = PathExpander::openFileReader
                             ((PathExpander *)pathExpander,name,(int *)&w.noescapes);
    if ((FileReader *)tmp._1016_8_ == (FileReader *)0x0) {
      name_local._4_4_ = -1;
    }
    else {
      if (ismain) {
        if ((int)w._32_4_ < 1) {
          pathExpander._16_4_ = 2;
        }
        else {
          pathExpander._16_4_ = 1;
          PathExpander::clearPathlist((PathExpander *)pathExpander);
        }
      }
      do {
        lVar3 = (**(code **)(*(long *)tmp._1016_8_ + 0x28))(tmp._1016_8_,&cp,0x400);
        if (lVar3 == 0) {
          if (tmp._1016_8_ != 0) {
            (**(code **)(*(long *)tmp._1016_8_ + 8))();
          }
          return 0;
        }
        lumpnum = lumpnum + 1;
        FCommandLine::FCommandLine((FCommandLine *)local_478,(char *)&cp,true);
        w._36_4_ = FCommandLine::argc((FCommandLine *)local_478);
        if (w._36_4_ == 0) {
          order_1 = 2;
          goto LAB_00416481;
        }
        pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,0);
        iVar1 = strcmp(pcVar4,"#extension");
        if (iVar1 == 0) {
          FCommandLine::Shift((FCommandLine *)local_478);
          w._36_4_ = w._36_4_ + -1;
        }
        else {
          pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,0);
          if (*pcVar4 == '#') {
            order_1 = 2;
            goto LAB_00416481;
          }
        }
        for (k = 0; k < (int)w._36_4_; k = k + 1) {
          pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,k);
          if (*pcVar4 == '#') {
            w._36_4_ = k;
            break;
          }
        }
        pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,0);
        iVar1 = strcmp(pcVar4,"comm");
        if (iVar1 == 0) {
LAB_00416477:
          order_1 = 0;
        }
        else {
          pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,0);
          iVar1 = strcmp(pcVar4,"HTTPproxy");
          if (iVar1 == 0) goto LAB_00416477;
          pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,0);
          iVar1 = strcmp(pcVar4,"FTPproxy");
          if (iVar1 == 0) goto LAB_00416477;
          pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,0);
          iVar1 = strcmp(pcVar4,"mailaddr");
          if (iVar1 == 0) goto LAB_00416477;
          pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,0);
          iVar1 = strcmp(pcVar4,"opt");
          if (iVar1 == 0) goto LAB_00416477;
          pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,0);
          iVar1 = strcmp(pcVar4,"timeout");
          if (iVar1 == 0) goto LAB_00416477;
          pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,0);
          iVar1 = strcmp(pcVar4,"copydrumset");
          if (iVar1 == 0) goto LAB_00416477;
          pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,0);
          iVar1 = strcmp(pcVar4,"copybank");
          if (iVar1 == 0) goto LAB_00416477;
          pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,0);
          iVar1 = strcmp(pcVar4,"undef");
          if (iVar1 == 0) goto LAB_00416477;
          pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,0);
          iVar1 = strcmp(pcVar4,"altassign");
          if (iVar1 == 0) goto LAB_00416477;
          pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,0);
          iVar1 = strcmp(pcVar4,"soundfont");
          if (iVar1 == 0) {
            if ((int)w._36_4_ < 2) {
              Printf("%s: line %d: No soundfont given\n",name,(ulong)(uint)lumpnum);
              if (tmp._1016_8_ != 0) {
                (**(code **)(*(long *)tmp._1016_8_ + 8))();
              }
              name_local._4_4_ = -2;
              order_1 = 1;
              goto LAB_00416481;
            }
            if (2 < (int)w._36_4_) {
              pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,2);
              iVar1 = strcmp(pcVar4,"remove");
              if (iVar1 == 0) {
                pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,1);
                font_remove(pcVar4);
                goto LAB_00416477;
              }
            }
            for (k = 2; k < (int)w._36_4_; k = k + 1) {
              pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,k);
              pcVar4 = strchr(pcVar4,0x3d);
              if (pcVar4 == (char *)0x0) {
                pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,k);
                Printf("%s: line %d: bad soundfont option %s\n",name,(ulong)(uint)lumpnum,pcVar4);
                if (tmp._1016_8_ != 0) {
                  (**(code **)(*(long *)tmp._1016_8_ + 8))();
                }
                name_local._4_4_ = -2;
                order_1 = 1;
                goto LAB_00416481;
              }
            }
            pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,1);
            font_add(pcVar4,0);
            goto LAB_00416477;
          }
          pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,0);
          iVar1 = strcmp(pcVar4,"font");
          if (iVar1 != 0) {
            pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,0);
            iVar1 = strcmp(pcVar4,"progbase");
            if (iVar1 != 0) {
              pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,0);
              iVar1 = strcmp(pcVar4,"map");
              if (iVar1 != 0) {
                pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,0);
                iVar1 = strcmp(pcVar4,"dir");
                if (iVar1 == 0) {
                  if (1 < (int)w._36_4_) {
                    for (k = 1; k < (int)w._36_4_; k = k + 1) {
                      pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,k);
                      PathExpander::addToPathlist((PathExpander *)pathExpander,pcVar4);
                    }
                    goto LAB_00416477;
                  }
                  Printf("%s: line %d: No directory given\n",name,(ulong)(uint)lumpnum);
                  if (tmp._1016_8_ != 0) {
                    (**(code **)(*(long *)tmp._1016_8_ + 8))();
                  }
                  name_local._4_4_ = -2;
                  order_1 = 1;
                }
                else {
                  pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,0);
                  iVar1 = strcmp(pcVar4,"source");
                  if (iVar1 == 0) {
                    if (1 < (int)w._36_4_) {
                      for (k = 1; k < (int)w._36_4_; k = k + 1) {
                        read_config_file::rcf_count = read_config_file::rcf_count + 1;
                        pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,k);
                        read_config_file(pcVar4,false);
                        read_config_file::rcf_count = read_config_file::rcf_count + -1;
                      }
                      goto LAB_00416477;
                    }
                    Printf("%s: line %d: No file name given\n",name,(ulong)(uint)lumpnum);
                    name_local._4_4_ = -2;
                    order_1 = 1;
                  }
                  else {
                    pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,0);
                    iVar1 = strcmp(pcVar4,"default");
                    if (iVar1 == 0) {
                      if (w._36_4_ == 2) {
                        pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,1);
                        FString::operator=((FString *)&def_instr_name,pcVar4);
                        goto LAB_00416477;
                      }
                      Printf("%s: line %d: Must specify exactly one patch name\n",name,
                             (ulong)(uint)lumpnum);
                      if (tmp._1016_8_ != 0) {
                        (**(code **)(*(long *)tmp._1016_8_ + 8))();
                      }
                      name_local._4_4_ = -2;
                      order_1 = 1;
                    }
                    else {
                      pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,0);
                      iVar1 = strcmp(pcVar4,"drumset");
                      if (iVar1 == 0) {
                        if ((int)w._36_4_ < 2) {
                          Printf("%s: line %d: No drum set number given\n",name,(ulong)(uint)lumpnum
                                );
                          if (tmp._1016_8_ != 0) {
                            (**(code **)(*(long *)tmp._1016_8_ + 8))();
                          }
                          name_local._4_4_ = -2;
                          order_1 = 1;
                        }
                        else {
                          pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,1);
                          iVar1 = atoi(pcVar4);
                          if ((-1 < iVar1) && (iVar1 < 0x80)) {
                            if ((&drumset)[iVar1] == 0) {
                              pTVar5 = (ToneBank *)operator_new(0x408);
                              ToneBank::ToneBank(pTVar5);
                              (&drumset)[iVar1] = pTVar5;
                            }
                            _j = (long *)(&drumset)[iVar1];
                            goto LAB_00416477;
                          }
                          Printf("%s: line %d: Drum set must be between 0 and 127\n",name,
                                 (ulong)(uint)lumpnum);
                          if (tmp._1016_8_ != 0) {
                            (**(code **)(*(long *)tmp._1016_8_ + 8))();
                          }
                          name_local._4_4_ = -2;
                          order_1 = 1;
                        }
                      }
                      else {
                        pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,0);
                        iVar1 = strcmp(pcVar4,"bank");
                        if (iVar1 == 0) {
                          if ((int)w._36_4_ < 2) {
                            Printf("%s: line %d: No bank number given\n",name,(ulong)(uint)lumpnum);
                            if (tmp._1016_8_ != 0) {
                              (**(code **)(*(long *)tmp._1016_8_ + 8))();
                            }
                            name_local._4_4_ = -2;
                            order_1 = 1;
                          }
                          else {
                            pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,1);
                            iVar1 = atoi(pcVar4);
                            if ((-1 < iVar1) && (iVar1 < 0x80)) {
                              if ((&tonebank)[iVar1] == 0) {
                                pTVar5 = (ToneBank *)operator_new(0x408);
                                ToneBank::ToneBank(pTVar5);
                                (&tonebank)[iVar1] = pTVar5;
                              }
                              _j = (long *)(&tonebank)[iVar1];
                              goto LAB_00416477;
                            }
                            Printf("%s: line %d: Tone bank must be between 0 and 127\n",name,
                                   (ulong)(uint)lumpnum);
                            if (tmp._1016_8_ != 0) {
                              (**(code **)(*(long *)tmp._1016_8_ + 8))();
                            }
                            name_local._4_4_ = -2;
                            order_1 = 1;
                          }
                        }
                        else if ((((int)w._36_4_ < 2) ||
                                 (pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,0),
                                 *pcVar4 < '0')) ||
                                (pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,0),
                                '9' < *pcVar4)) {
                          Printf("%s: line %d: syntax error\n",name,(ulong)(uint)lumpnum);
                          if (tmp._1016_8_ != 0) {
                            (**(code **)(*(long *)tmp._1016_8_ + 8))();
                          }
                          name_local._4_4_ = -2;
                          order_1 = 1;
                        }
                        else {
                          pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,0);
                          iVar1 = atoi(pcVar4);
                          if ((iVar1 < 0) || (0x7f < iVar1)) {
                            Printf("%s: line %d: Program must be between 0 and 127\n",name,
                                   (ulong)(uint)lumpnum);
                            if (tmp._1016_8_ != 0) {
                              (**(code **)(*(long *)tmp._1016_8_ + 8))();
                            }
                            name_local._4_4_ = -2;
                            order_1 = 1;
                          }
                          else {
                            if (_j != (long *)0x0) {
                              *(undefined1 *)(*_j + 0x1e + (long)iVar1 * 0x20) = 0xff;
                              *(undefined1 *)(*_j + 0x1d + (long)iVar1 * 0x20) = 0xff;
                              *(undefined1 *)(*_j + 0x1c + (long)iVar1 * 0x20) = 0xff;
                              *(undefined4 *)(*_j + 0x18 + (long)iVar1 * 0x20) = 0xffffffff;
                              *(undefined4 *)(*_j + 0x14 + (long)iVar1 * 0x20) = 0xffffffff;
                              *(undefined4 *)(*_j + 0x10 + (long)iVar1 * 0x20) = 0xffffffff;
                              *(undefined4 *)(*_j + 0xc + (long)iVar1 * 0x20) = 0xffffffff;
                              *(undefined4 *)(*_j + 8 + (long)iVar1 * 0x20) = 0xffffffff;
                              pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,1);
                              iVar2 = strcmp(pcVar4,"%font");
                              if (iVar2 == 0) {
                                pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,2);
                                FString::operator=((FString *)(*_j + (long)iVar1 * 0x20),pcVar4);
                                pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,3);
                                iVar2 = atoi(pcVar4);
                                *(int *)(*_j + 0x10 + (long)iVar1 * 0x20) = iVar2;
                                pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,4);
                                iVar2 = atoi(pcVar4);
                                *(int *)(*_j + (long)iVar1 * 0x20 + 0x14) = iVar2;
                                if (((int)w._36_4_ < 6) ||
                                   ((*(int *)(*_j + (long)iVar1 * 0x20 + 0x10) != 0x80 &&
                                    ((pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,5)
                                     , *pcVar4 < '0' ||
                                     (pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,5)
                                     , '9' < *pcVar4)))))) {
                                  line = 5;
                                }
                                else {
                                  pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,5);
                                  iVar2 = atoi(pcVar4);
                                  *(int *)(*_j + (long)iVar1 * 0x20 + 0x18) = iVar2;
                                  line = 6;
                                }
                                pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,2);
                                font_add(pcVar4,0xfe);
                              }
                              else {
                                pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,1);
                                FString::operator=((FString *)(*_j + (long)iVar1 * 0x20),pcVar4);
                                line = 2;
                              }
                              for (; line < (int)w._36_4_; line = line + 1) {
                                pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,line);
                                pcVar4 = strchr(pcVar4,0x3d);
                                if (pcVar4 == (char *)0x0) {
                                  pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,line);
                                  Printf("%s: line %d: bad patch option %s\n",name,
                                         (ulong)(uint)lumpnum,pcVar4);
                                  if (tmp._1016_8_ != 0) {
                                    (**(code **)(*(long *)tmp._1016_8_ + 8))();
                                  }
                                  name_local._4_4_ = -2;
                                  order_1 = 1;
                                  goto LAB_00416481;
                                }
                                __s1 = pcVar4 + 1;
                                *pcVar4 = '\0';
                                pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,line);
                                iVar2 = strcmp(pcVar4,"amp");
                                if (iVar2 != 0) {
                                  pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,line);
                                  iVar2 = strcmp(pcVar4,"note");
                                  if (iVar2 == 0) {
                                    iVar2 = atoi(__s1);
                                    if ((((iVar2 < 0) || (0x7f < iVar2)) || (*__s1 < '0')) ||
                                       ('9' < *__s1)) {
                                      Printf("%s: line %d: note must be between 0 and 127\n",name,
                                             (ulong)(uint)lumpnum);
                                      if (tmp._1016_8_ != 0) {
                                        (**(code **)(*(long *)tmp._1016_8_ + 8))();
                                      }
                                      name_local._4_4_ = -2;
                                      order_1 = 1;
                                      goto LAB_00416481;
                                    }
                                    *(int *)(*_j + (long)iVar1 * 0x20 + 8) = iVar2;
                                  }
                                  else {
                                    pcVar4 = FCommandLine::operator[]
                                                       ((FCommandLine *)local_478,line);
                                    iVar2 = strcmp(pcVar4,"pan");
                                    if (iVar2 == 0) {
                                      iVar2 = strcmp(__s1,"center");
                                      if (iVar2 == 0) {
                                        words = 0x40;
                                      }
                                      else {
                                        iVar2 = strcmp(__s1,"left");
                                        if (iVar2 == 0) {
                                          words = 0;
                                        }
                                        else {
                                          iVar2 = strcmp(__s1,"right");
                                          if (iVar2 == 0) {
                                            words = 0x7f;
                                          }
                                          else {
                                            iVar2 = atoi(__s1);
                                            words = ((iVar2 + 100) * 100) / 0x9d;
                                          }
                                        }
                                      }
                                      if (((words < 0) || (0x7f < words)) ||
                                         (((words == 0 && (*__s1 != '-')) &&
                                          ((*__s1 < '0' || ('9' < *__s1)))))) {
                                        Printf("%s: line %d: panning must be left, right, center, or between -100 and 100\n"
                                               ,name,(ulong)(uint)lumpnum);
                                        if (tmp._1016_8_ != 0) {
                                          (**(code **)(*(long *)tmp._1016_8_ + 8))();
                                        }
                                        name_local._4_4_ = -2;
                                        order_1 = 1;
                                        goto LAB_00416481;
                                      }
                                      *(int *)(*_j + (long)iVar1 * 0x20 + 0xc) = words;
                                    }
                                    else {
                                      pcVar4 = FCommandLine::operator[]
                                                         ((FCommandLine *)local_478,line);
                                      iVar2 = strcmp(pcVar4,"keep");
                                      if (iVar2 == 0) {
                                        iVar2 = strcmp(__s1,"env");
                                        if (iVar2 == 0) {
                                          *(undefined1 *)(*_j + (long)iVar1 * 0x20 + 0x1d) = 0;
                                        }
                                        else {
                                          iVar2 = strcmp(__s1,"loop");
                                          if (iVar2 != 0) {
                                            Printf("%s: line %d: keep must be env or loop\n",name,
                                                   (ulong)(uint)lumpnum);
                                            if (tmp._1016_8_ != 0) {
                                              (**(code **)(*(long *)tmp._1016_8_ + 8))();
                                            }
                                            name_local._4_4_ = -2;
                                            order_1 = 1;
                                            goto LAB_00416481;
                                          }
                                          *(undefined1 *)(*_j + (long)iVar1 * 0x20 + 0x1c) = 0;
                                        }
                                      }
                                      else {
                                        pcVar4 = FCommandLine::operator[]
                                                           ((FCommandLine *)local_478,line);
                                        iVar2 = strcmp(pcVar4,"strip");
                                        if (iVar2 != 0) {
                                          pcVar4 = FCommandLine::operator[]
                                                             ((FCommandLine *)local_478,line);
                                          Printf("%s: line %d: bad patch option %s\n",name,
                                                 (ulong)(uint)lumpnum,pcVar4);
                                          if (tmp._1016_8_ != 0) {
                                            (**(code **)(*(long *)tmp._1016_8_ + 8))();
                                          }
                                          name_local._4_4_ = -2;
                                          order_1 = 1;
                                          goto LAB_00416481;
                                        }
                                        iVar2 = strcmp(__s1,"env");
                                        if (iVar2 == 0) {
                                          *(undefined1 *)(*_j + (long)iVar1 * 0x20 + 0x1d) = 1;
                                        }
                                        else {
                                          iVar2 = strcmp(__s1,"loop");
                                          if (iVar2 == 0) {
                                            *(undefined1 *)(*_j + (long)iVar1 * 0x20 + 0x1c) = 1;
                                          }
                                          else {
                                            iVar2 = strcmp(__s1,"tail");
                                            if (iVar2 != 0) {
                                              Printf(
                                                  "%s: line %d: strip must be env, loop, or tail\n",
                                                  name,(ulong)(uint)lumpnum);
                                              if (tmp._1016_8_ != 0) {
                                                (**(code **)(*(long *)tmp._1016_8_ + 8))();
                                              }
                                              name_local._4_4_ = -2;
                                              order_1 = 1;
                                              goto LAB_00416481;
                                            }
                                            *(undefined1 *)(*_j + (long)iVar1 * 0x20 + 0x1e) = 1;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                              goto LAB_00416477;
                            }
                            Printf("%s: line %d: Must specify tone bank or drum set before assignment\n"
                                   ,name,(ulong)(uint)lumpnum);
                            if (tmp._1016_8_ != 0) {
                              (**(code **)(*(long *)tmp._1016_8_ + 8))();
                            }
                            name_local._4_4_ = -2;
                            order_1 = 1;
                          }
                        }
                      }
                    }
                  }
                }
                goto LAB_00416481;
              }
            }
            goto LAB_00416477;
          }
          instr = -1;
          local_498 = -1;
          local_49c = -1;
          if (2 < (int)w._36_4_) {
            pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,1);
            iVar1 = strcmp(pcVar4,"exclude");
            if (iVar1 == 0) {
              bank_1 = 0xfe;
              k = 2;
            }
            else {
              pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,1);
              iVar1 = strcmp(pcVar4,"order");
              if (iVar1 != 0) {
                Printf("%s: line %d: font subcommand must be \'order\' or \'exclude\'\n",name,
                       (ulong)(uint)lumpnum);
                if (tmp._1016_8_ != 0) {
                  (**(code **)(*(long *)tmp._1016_8_ + 8))();
                }
                name_local._4_4_ = -2;
                order_1 = 1;
                goto LAB_00416481;
              }
              pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,2);
              bank_1 = atoi(pcVar4);
              k = 3;
            }
            if (k < (int)w._36_4_) {
              pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,k);
              instr = atoi(pcVar4);
              k = k + 1;
            }
            if (k < (int)w._36_4_) {
              pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,k);
              local_498 = atoi(pcVar4);
              k = k + 1;
            }
            if (k < (int)w._36_4_) {
              pcVar4 = FCommandLine::operator[]((FCommandLine *)local_478,k);
              local_49c = atoi(pcVar4);
            }
            if (instr != 0x80) {
              local_49c = local_498;
              local_498 = instr;
            }
            instr = (int)(instr == 0x80);
            font_order(bank_1,instr,local_498,local_49c);
            goto LAB_00416477;
          }
          Printf("%s: line %d: syntax error\n",name,(ulong)(uint)lumpnum);
          if (tmp._1016_8_ != 0) {
            (**(code **)(*(long *)tmp._1016_8_ + 8))();
          }
          name_local._4_4_ = -2;
          order_1 = 1;
        }
LAB_00416481:
        FCommandLine::~FCommandLine((FCommandLine *)local_478);
      } while ((order_1 == 0) || (order_1 != 1));
    }
  }
  else {
    Printf("Timidity: Probable source loop in configuration files\n");
    name_local._4_4_ = -1;
  }
  return name_local._4_4_;
}

Assistant:

static int read_config_file(const char *name, bool ismain)
{
	FileReader *fp;
	char tmp[1024], *cp;
	ToneBank *bank = NULL;
	int i, j, k, line = 0, words;
	static int rcf_count = 0;
	int lumpnum;

	if (rcf_count > 50)
	{
		Printf("Timidity: Probable source loop in configuration files\n");
		return (-1);
	}

	if (ismain) pathExpander.openmode = PathExpander::OM_FILEORLUMP;

	if (!(fp = pathExpander.openFileReader(name, &lumpnum)))
		return -1;

	if (ismain)
	{
		if (lumpnum > 0)
		{
			pathExpander.openmode = PathExpander::OM_LUMP;
			pathExpander.clearPathlist();	// when reading from a PK3 we don't want to use any external path
		}
		else
		{
			pathExpander.openmode = PathExpander::OM_FILE;
		}
	}

	while (fp->Gets(tmp, sizeof(tmp)))
	{
		line++;
		FCommandLine w(tmp, true);
		words = w.argc();
		if (words == 0) continue;

		/* Originally the TiMidity++ extensions were prefixed like this */
		if (strcmp(w[0], "#extension") == 0)
		{
			w.Shift();
			words--;
		}
		else if (*w[0] == '#')
		{
			continue;
		}

		for (i = 0; i < words; ++i)
		{
			if (*w[i] == '#')
			{
				words = i;
				break;
			}
		}

		/*
		 * TiMidity++ adds a number of extensions to the config file format.
		 * Many of them are completely irrelevant to SDL_sound, but at least
		 * we shouldn't choke on them.
		 *
		 * Unfortunately the documentation for these extensions is often quite
		 * vague, gramatically strange or completely absent.
		 */
		if (
			!strcmp(w[0], "comm")			/* "comm" program second        */
			|| !strcmp(w[0], "HTTPproxy")	/* "HTTPproxy" hostname:port    */
			|| !strcmp(w[0], "FTPproxy")	/* "FTPproxy" hostname:port     */
			|| !strcmp(w[0], "mailaddr")	/* "mailaddr" your-mail-address */
			|| !strcmp(w[0], "opt")			/* "opt" timidity-options       */
			)
		{
			/*
			* + "comm" sets some kind of comment -- the documentation is too
			*   vague for me to understand at this time.
			* + "HTTPproxy", "FTPproxy" and "mailaddr" are for reading data
			*   over a network, rather than from the file system.
			* + "opt" specifies default options for TiMidity++.
			*
			* These are all quite useless for our version of TiMidity, so
			* they can safely remain no-ops.
			*/
		}
		else if (!strcmp(w[0], "timeout"))	/* "timeout" program second */
		{
			/*
			* Specifies a timeout value of the program. A number of seconds
			* before TiMidity kills the note. This may be useful to implement
			* later, but I don't see any urgent need for it.
			*/
			//Printf("FIXME: Implement \"timeout\" in TiMidity config.\n");
		}
		else if (!strcmp(w[0], "copydrumset")	/* "copydrumset" drumset */
			|| !strcmp(w[0], "copybank"))		/* "copybank" bank       */
		{
			/*
			* Copies all the settings of the specified drumset or bank to
			* the current drumset or bank. May be useful later, but not a
			* high priority.
			*/
			//Printf("FIXME: Implement \"%s\" in TiMidity config.\n", w[0]);
		}
		else if (!strcmp(w[0], "undef"))		/* "undef" progno */
		{
			/*
			* Undefines the tone "progno" of the current tone bank (or
			* drum set?). Not a high priority.
			*/
			//Printf("FIXME: Implement \"undef\" in TiMidity config.\n");
		}
		else if (!strcmp(w[0], "altassign")) /* "altassign" prog1 prog2 ... */
		{
			/*
			* Sets the alternate assign for drum set. Whatever that's
			* supposed to mean.
			*/
			//Printf("FIXME: Implement \"altassign\" in TiMidity config.\n");
		}
		else if (!strcmp(w[0], "soundfont"))
		{
			/*
			* "soundfont" sf_file "remove"
			* "soundfont" sf_file ["order=" order] ["cutoff=" cutoff]
			*                     ["reso=" reso] ["amp=" amp]
			*/
			if (words < 2)
			{
				Printf("%s: line %d: No soundfont given\n", name, line);
				delete fp;
				return -2;
			}
			if (words > 2 && !strcmp(w[2], "remove"))
			{
				font_remove(w[1]);
			}
			else
			{
				int order = 0;

				for (i = 2; i < words; ++i)
				{
					if (!(cp = strchr(w[i], '=')))
					{
						Printf("%s: line %d: bad soundfont option %s\n", name, line, w[i]);
						delete fp;
						return -2;
					}
				}
				font_add(w[1], order);
			}
		}
		else if (!strcmp(w[0], "font"))
		{
			/*
			* "font" "exclude" bank preset keynote
			* "font" "order" order bank preset keynote
			*/
			int order, drum = -1, bank = -1, instr = -1;

			if (words < 3)
			{
				Printf("%s: line %d: syntax error\n", name, line);
				delete fp;
				return -2;
			}

			if (!strcmp(w[1], "exclude"))
			{
				order = 254;
				i = 2;
			}
			else if (!strcmp(w[1], "order"))
			{
				order = atoi(w[2]);
				i = 3;
			}
			else
			{
				Printf("%s: line %d: font subcommand must be 'order' or 'exclude'\n", name, line);
				delete fp;
				return -2;
			}
			if (i < words)
			{
				drum = atoi(w[i++]);
			}
			if (i < words)
			{
				bank = atoi(w[i++]);
			}
			if (i < words)
			{
				instr = atoi(w[i++]);
			}
			if (drum != 128)
			{
				instr = bank;
				bank = drum;
				drum = 0;
			}
			else
			{
				drum = 1;
			}
			font_order(order, drum, bank, instr);
		}
		else if (!strcmp(w[0], "progbase"))
		{
			/*
			* The documentation for this makes absolutely no sense to me, but
			* apparently it sets some sort of base offset for tone numbers.
			* Why anyone would want to do this is beyond me.
			*/
			//Printf("FIXME: Implement \"progbase\" in TiMidity config.\n");
		}
		else if (!strcmp(w[0], "map")) /* "map" name set1 elem1 set2 elem2 */
		{
			/*
			* This extension is the one we will need to implement, as it is
			* used by the "eawpats". Unfortunately I cannot find any
			* documentation whatsoever for it, but it looks like it's used
			* for remapping one instrument to another somehow.
			*/
			//Printf("FIXME: Implement \"map\" in TiMidity config.\n");
		}

		/* Standard TiMidity config */

		else if (!strcmp(w[0], "dir"))
		{
			if (words < 2)
			{
				Printf("%s: line %d: No directory given\n", name, line);
				delete fp;
				return -2;
			}
			for (i = 1; i < words; i++)
				pathExpander.addToPathlist(w[i]);
		}
		else if (!strcmp(w[0], "source"))
		{
			if (words < 2)
			{
				Printf("%s: line %d: No file name given\n", name, line);
				return -2;
			}
			for (i=1; i<words; i++)
			{
				rcf_count++;
				read_config_file(w[i], false);
				rcf_count--;
			}
		}
		else if (!strcmp(w[0], "default"))
		{
			if (words != 2)
			{
				Printf("%s: line %d: Must specify exactly one patch name\n", name, line);
				delete fp;
				return -2;
			}
			def_instr_name = w[1];
		}
		else if (!strcmp(w[0], "drumset"))
		{
			if (words < 2)
			{
				Printf("%s: line %d: No drum set number given\n", name, line);
				delete fp;
				return -2;
			}
			i = atoi(w[1]);
			if (i < 0 || i > 127)
			{
				Printf("%s: line %d: Drum set must be between 0 and 127\n", name, line);
				delete fp;
				return -2;
			}
			if (drumset[i] == NULL)
			{
				drumset[i] = new ToneBank;
			}
			bank = drumset[i];
		}
		else if (!strcmp(w[0], "bank"))
		{
			if (words < 2)
			{
				Printf("%s: line %d: No bank number given\n", name, line);
				delete fp;
				return -2;
			}
			i = atoi(w[1]);
			if (i < 0 || i > 127)
			{
				Printf("%s: line %d: Tone bank must be between 0 and 127\n", name, line);
				delete fp;
				return -2;
			}
			if (tonebank[i] == NULL)
			{
				tonebank[i] = new ToneBank;
			}
			bank = tonebank[i];
		}
		else
		{
			if ((words < 2) || (*w[0] < '0' || *w[0] > '9'))
			{
				Printf("%s: line %d: syntax error\n", name, line);
				delete fp;
				return -2;
			}
			i = atoi(w[0]);
			if (i < 0 || i > 127)
			{
				Printf("%s: line %d: Program must be between 0 and 127\n", name, line);
				delete fp;
				return -2;
			}
			if (bank == NULL)
			{
				Printf("%s: line %d: Must specify tone bank or drum set before assignment\n", name, line);
				delete fp;
				return -2;
			}
			bank->tone[i].note = bank->tone[i].pan =
				bank->tone[i].fontbank = bank->tone[i].fontpreset =
				bank->tone[i].fontnote = bank->tone[i].strip_loop = 
				bank->tone[i].strip_envelope = bank->tone[i].strip_tail = -1;

			if (!strcmp(w[1], "%font"))
			{
				bank->tone[i].name = w[2];
				bank->tone[i].fontbank = atoi(w[3]);
				bank->tone[i].fontpreset = atoi(w[4]);
				if (words > 5 && (bank->tone[i].fontbank == 128 || (w[5][0] >= '0' && w[5][0] <= '9')))
				{
					bank->tone[i].fontnote = atoi(w[5]);
					j = 6;
				}
				else
				{
					j = 5;
				}
				font_add(w[2], 254);
			}
			else
			{
				bank->tone[i].name = w[1];
				j = 2;
			}

			for (; j<words; j++)
			{
				if (!(cp=strchr(w[j], '=')))
				{
					Printf("%s: line %d: bad patch option %s\n", name, line, w[j]);
					delete fp;
					return -2;
				}
				*cp++ = 0;
				if (!strcmp(w[j], "amp"))
				{
					/* Ignored */
				}
				else if (!strcmp(w[j], "note"))
				{
					k = atoi(cp);
					if ((k < 0 || k > 127) || (*cp < '0' || *cp > '9'))
					{
						Printf("%s: line %d: note must be between 0 and 127\n", name, line);
						delete fp;
						return -2;
					}
					bank->tone[i].note = k;
				}
				else if (!strcmp(w[j], "pan"))
				{
					if (!strcmp(cp, "center"))
						k = 64;
					else if (!strcmp(cp, "left"))
						k = 0;
					else if (!strcmp(cp, "right"))
						k = 127;
					else
						k = ((atoi(cp)+100) * 100) / 157;
					if ((k < 0 || k > 127) ||
						(k == 0 && *cp != '-' && (*cp < '0' || *cp > '9')))
					{
						Printf("%s: line %d: panning must be left, right, "
							"center, or between -100 and 100\n", name, line);
						delete fp;
						return -2;
					}
					bank->tone[i].pan = k;
				}
				else if (!strcmp(w[j], "keep"))
				{
					if (!strcmp(cp, "env"))
						bank->tone[i].strip_envelope = 0;
					else if (!strcmp(cp, "loop"))
						bank->tone[i].strip_loop = 0;
					else
					{
						Printf("%s: line %d: keep must be env or loop\n", name, line);
						delete fp;
						return -2;
					}
				}
				else if (!strcmp(w[j], "strip"))
				{
					if (!strcmp(cp, "env"))
						bank->tone[i].strip_envelope = 1;
					else if (!strcmp(cp, "loop"))
						bank->tone[i].strip_loop = 1;
					else if (!strcmp(cp, "tail"))
						bank->tone[i].strip_tail = 1;
					else
					{
						Printf("%s: line %d: strip must be env, loop, or tail\n", name, line);
						delete fp;
						return -2;
					}
				}
				else
				{
					Printf("%s: line %d: bad patch option %s\n", name, line, w[j]);
					delete fp;
					return -2;
				}
			}
		}
	}
	/*
	if (ferror(fp))
	{
		Printf("Can't read %s: %s\n", name, strerror(errno));
		close_file(fp);
		return -2;
	}
	*/
	delete fp;
	return 0;
}